

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O2

dgGoogol * __thiscall
dgGoogol::operator*(dgGoogol *__return_storage_ptr__,dgGoogol *this,dgGoogol *A)

{
  short sVar1;
  short sVar2;
  HaI32 j;
  HaI32 HVar3;
  dgGoogol *tmp;
  HaI32 i;
  uint uVar4;
  ulong uVar5;
  dgGoogol *this_00;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  HaU64 mantissaAcc [8];
  HaU64 mantissaScale [8];
  
  if ((long)this->m_mantissa[0] < 0) {
    __assert_fail("hacd::HaI64 (m_mantissa[0]) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgGoogol.cpp"
                  ,0x117,"dgGoogol dgGoogol::operator*(const dgGoogol &) const");
  }
  if (-1 < (long)A->m_mantissa[0]) {
    if (A->m_mantissa[0] == 0 || this->m_mantissa[0] == 0) {
      dgGoogol(__return_storage_ptr__,0.0);
    }
    else {
      mantissaAcc = (HaU64  [8])ZEXT864(0);
      this_00 = __return_storage_ptr__;
      for (uVar4 = 3; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        if (this->m_mantissa[uVar4] != 0) {
          mantissaScale = (HaU64  [8])ZEXT1664(ZEXT816(0) << 0x40);
          this_00 = A;
          ScaleMantissa(A,mantissaScale + uVar4,this->m_mantissa[uVar4]);
          uVar7 = 0;
          for (uVar6 = 7; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
            uVar5 = mantissaScale[uVar6];
            bVar8 = CARRY8(uVar5,mantissaAcc[uVar6]);
            uVar5 = uVar5 + mantissaAcc[uVar6];
            this_00 = (dgGoogol *)CONCAT71((int7)((ulong)this_00 >> 8),bVar8);
            mantissaAcc[uVar6] = uVar7 + uVar5;
            uVar7 = (ulong)(CARRY8(uVar7,uVar5) || bVar8);
          }
        }
      }
      HVar3 = LeadinZeros(this_00,mantissaAcc[0]);
      uVar6 = 0;
      for (uVar4 = 7; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        uVar7 = mantissaAcc[uVar4] << ((ulong)(HVar3 - 2) & 0x3f) | uVar6;
        uVar6 = mantissaAcc[uVar4] >> ((ulong)(0x42 - HVar3) & 0x3f);
        mantissaAcc[uVar4] = uVar7;
      }
      sVar1 = this->m_exponent;
      sVar2 = A->m_exponent;
      dgGoogol(__return_storage_ptr__);
      __return_storage_ptr__->m_sign = A->m_sign ^ this->m_sign;
      __return_storage_ptr__->m_exponent = (sVar1 - (short)HVar3) + sVar2 + 4;
      __return_storage_ptr__->m_mantissa[0] = mantissaAcc[0];
      __return_storage_ptr__->m_mantissa[1] = mantissaAcc[1];
      __return_storage_ptr__->m_mantissa[2] = mantissaAcc[2];
      __return_storage_ptr__->m_mantissa[3] = mantissaAcc[3];
    }
    return __return_storage_ptr__;
  }
  __assert_fail("hacd::HaI64 (A.m_mantissa[0]) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgGoogol.cpp"
                ,0x118,"dgGoogol dgGoogol::operator*(const dgGoogol &) const");
}

Assistant:

dgGoogol dgGoogol::operator* (const dgGoogol &A) const
{
	HACD_ASSERT (hacd::HaI64 (m_mantissa[0]) >= 0);
	HACD_ASSERT (hacd::HaI64 (A.m_mantissa[0]) >= 0);

	if (m_mantissa[0] && A.m_mantissa[0]) {
		hacd::HaU64 mantissaAcc[DG_GOOGOL_SIZE * 2];
		memset (mantissaAcc, 0, sizeof (mantissaAcc));
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 a = m_mantissa[i];
			if (a) {
				hacd::HaU64 mantissaScale[2 * DG_GOOGOL_SIZE];
				memset (mantissaScale, 0, sizeof (mantissaScale));
				A.ScaleMantissa (&mantissaScale[i], a);

				hacd::HaU64 carrier = 0;
				for (hacd::HaI32 j = 2 * DG_GOOGOL_SIZE - 1; j >= 0; j --) {
					hacd::HaU64 m0 = mantissaAcc[j];
					hacd::HaU64 m1 = mantissaScale[j];
					mantissaAcc[j] = m0 + m1 + carrier;
					carrier = CheckCarrier (m0, m1) | CheckCarrier (m0 + m1, carrier);
				}
			}
		}
		
		hacd::HaU64 carrier = 0;
		hacd::HaI32 bits = LeadinZeros (mantissaAcc[0]) - 2;
		for (hacd::HaI32 i = 2 * DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 a = mantissaAcc[i];
			mantissaAcc[i] = (a << bits) | carrier;
			carrier = a >> (64 - bits);
		}

		hacd::HaI32 exp = m_exponent + A.m_exponent - (bits - 2);

		dgGoogol tmp;
		tmp.m_sign = m_sign ^ A.m_sign;
		tmp.m_exponent = hacd::HaI16 (exp);
		memcpy (tmp.m_mantissa, mantissaAcc, sizeof (m_mantissa));

		return tmp;
	} 
	return dgGoogol(0.0);
}